

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool check_owner_password_V4(string *user_password,string *owner_password,EncryptionData *data)

{
  bool bVar1;
  int key_len;
  int iVar2;
  string *str;
  uchar *puVar3;
  size_t max_len;
  int iterations;
  allocator local_b1;
  undefined1 local_b0 [6];
  bool result;
  string new_user_password;
  allocator local_79;
  undefined1 local_78 [8];
  string k1;
  uchar O_data [32];
  uchar key [16];
  EncryptionData *data_local;
  string *owner_password_local;
  string *user_password_local;
  
  compute_O_rc4_key(user_password,owner_password,data,O_data + 0x18);
  str = QPDF::EncryptionData::getO_abi_cxx11_(data);
  puVar3 = QUtil::unsigned_char_pointer(str);
  k1.field_2._8_8_ = *(undefined8 *)puVar3;
  O_data._0_8_ = *(undefined8 *)(puVar3 + 8);
  O_data._8_8_ = *(undefined8 *)(puVar3 + 0x10);
  O_data._16_8_ = *(undefined8 *)(puVar3 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,(char *)(O_data + 0x18),0x10,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  new_user_password.field_2._8_4_ = QPDF::EncryptionData::getLengthBytes(data);
  max_len = QIntC::to_size<int>((int *)(new_user_password.field_2._M_local_buf + 8));
  pad_short_parameter((string *)local_78,max_len);
  puVar3 = QUtil::unsigned_char_pointer((string *)local_78);
  key_len = QPDF::EncryptionData::getLengthBytes(data);
  iVar2 = QPDF::EncryptionData::getR(data);
  iterations = 1;
  if (2 < iVar2) {
    iterations = 0x14;
  }
  iterate_rc4((uchar *)(k1.field_2._M_local_buf + 8),0x20,puVar3,key_len,iterations,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,k1.field_2._M_local_buf + 8,0x20,&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  bVar1 = check_user_password((string *)local_b0,data);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)user_password,(string *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_78);
  return bVar1;
}

Assistant:

static bool
check_owner_password_V4(
    std::string& user_password, std::string const& owner_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.7 from the PDF 1.7 Reference Manual

    unsigned char key[OU_key_bytes_V4];
    compute_O_rc4_key(user_password, owner_password, data, key);
    unsigned char O_data[key_bytes];
    memcpy(O_data, QUtil::unsigned_char_pointer(data.getO()), key_bytes);
    std::string k1(reinterpret_cast<char*>(key), OU_key_bytes_V4);
    pad_short_parameter(k1, QIntC::to_size(data.getLengthBytes()));
    iterate_rc4(
        O_data,
        key_bytes,
        QUtil::unsigned_char_pointer(k1),
        data.getLengthBytes(),
        (data.getR() >= 3) ? 20 : 1,
        true);
    std::string new_user_password = std::string(reinterpret_cast<char*>(O_data), key_bytes);
    bool result = false;
    if (check_user_password(new_user_password, data)) {
        result = true;
        user_password = new_user_password;
    }
    return result;
}